

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O0

void tc_uECC_vli_mmod(tc_uECC_word_t *result,tc_uECC_word_t *product,tc_uECC_word_t *mod,
                     wordcount_t num_words)

{
  wordcount_t num_words_00;
  byte bVar1;
  bitcount_t bVar2;
  uint uVar3;
  tc_uECC_word_t atStack_268 [103];
  char local_c9;
  tc_uECC_word_t diff;
  uint uStack_c4;
  wordcount_t i;
  tc_uECC_word_t borrow;
  tc_uECC_word_t carry;
  wordcount_t bit_shift;
  wordcount_t word_shift;
  bitcount_t shift;
  tc_uECC_word_t index;
  tc_uECC_word_t *v [2];
  tc_uECC_word_t tmp [16];
  tc_uECC_word_t mod_multiple [16];
  wordcount_t num_words_local;
  tc_uECC_word_t *mod_local;
  tc_uECC_word_t *product_local;
  tc_uECC_word_t *result_local;
  
  _bit_shift = v + 1;
  v[0] = product;
  bVar2 = tc_uECC_vli_numBits(mod,num_words);
  borrow._2_2_ = num_words * 0x40 - bVar2;
  num_words_00 = (wordcount_t)((int)borrow._2_2_ / 0x20);
  bVar1 = (byte)((int)borrow._2_2_ % 0x20);
  uStack_c4 = 0;
  tc_uECC_vli_clear(tmp + 0xe,num_words_00);
  if ((char)bVar1 < '\x01') {
    tc_uECC_vli_set(tmp + (long)(int)num_words_00 + 0xe,mod,num_words);
  }
  else {
    for (carry = 0; carry < (uint)(int)num_words; carry = carry + 1) {
      tmp[(ulong)((int)num_words_00 + carry) + 0xe] = mod[carry] << (bVar1 & 0x1f) | uStack_c4;
      uStack_c4 = mod[carry] >> (0x20 - bVar1 & 0x1f);
    }
  }
  carry = 1;
  for (; -1 < borrow._2_2_; borrow._2_2_ = borrow._2_2_ + -1) {
    diff = 0;
    for (local_c9 = '\0';
        SBORROW4((int)local_c9,num_words * 2) != (int)local_c9 + num_words * -2 < 0;
        local_c9 = local_c9 + '\x01') {
      uVar3 = (*(int *)(*(long *)(&bit_shift + (ulong)carry * 8) + (long)local_c9 * 4) -
              tmp[(long)local_c9 + 0xe]) - diff;
      if (uVar3 != *(uint *)(*(long *)(&bit_shift + (ulong)carry * 8) + (long)local_c9 * 4)) {
        diff = (tc_uECC_word_t)
               (*(uint *)(*(long *)(&bit_shift + (ulong)carry * 8) + (long)local_c9 * 4) < uVar3);
      }
      *(uint *)(*(long *)(&bit_shift + (ulong)(1 - carry) * 8) + (long)local_c9 * 4) = uVar3;
    }
    carry = (tc_uECC_word_t)((carry != diff ^ 0xffU) & 1);
    tc_uECC_vli_rshift1(tmp + 0xe,num_words);
    tmp[(long)(num_words + -1) + 0xe] =
         tmp[(long)num_words + 0xe] << 0x1f | tmp[(long)(num_words + -1) + 0xe];
    tc_uECC_vli_rshift1(tmp + (long)(int)num_words + 0xe,num_words);
  }
  tc_uECC_vli_set(result,*(tc_uECC_word_t **)(&bit_shift + (ulong)carry * 8),num_words);
  return;
}

Assistant:

void tc_uECC_vli_mmod(tc_uECC_word_t *result, tc_uECC_word_t *product,
    		   const tc_uECC_word_t *mod, wordcount_t num_words)
{
	tc_uECC_word_t mod_multiple[2 * NUM_ECC_WORDS];
	tc_uECC_word_t tmp[2 * NUM_ECC_WORDS];
	tc_uECC_word_t *v[2] = {tmp, product};
	tc_uECC_word_t index;

	/* Shift mod so its highest set bit is at the maximum position. */
	bitcount_t shift = (num_words * 2 * tc_uECC_WORD_BITS) -
			   tc_uECC_vli_numBits(mod, num_words);
	wordcount_t word_shift = shift / tc_uECC_WORD_BITS;
	wordcount_t bit_shift = shift % tc_uECC_WORD_BITS;
	tc_uECC_word_t carry = 0;
	tc_uECC_vli_clear(mod_multiple, word_shift);
	if (bit_shift > 0) {
		for(index = 0; index < (tc_uECC_word_t)num_words; ++index) {
			mod_multiple[word_shift + index] = (mod[index] << bit_shift) | carry;
			carry = mod[index] >> (tc_uECC_WORD_BITS - bit_shift);
		}
	} else {
		tc_uECC_vli_set(mod_multiple + word_shift, mod, num_words);
	}

	for (index = 1; shift >= 0; --shift) {
		tc_uECC_word_t borrow = 0;
		wordcount_t i;
		for (i = 0; i < num_words * 2; ++i) {
			tc_uECC_word_t diff = v[index][i] - mod_multiple[i] - borrow;
			if (diff != v[index][i]) {
				borrow = (diff > v[index][i]);
			}
			v[1 - index][i] = diff;
		}
		/* Swap the index if there was no borrow */
		index = !(index ^ borrow);
		tc_uECC_vli_rshift1(mod_multiple, num_words);
		mod_multiple[num_words - 1] |= mod_multiple[num_words] <<
					       (tc_uECC_WORD_BITS - 1);
		tc_uECC_vli_rshift1(mod_multiple + num_words, num_words);
	}
	tc_uECC_vli_set(result, v[index], num_words);
}